

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> __thiscall
google::protobuf::internal::ExtensionSet::Insert(ExtensionSet *this,int key)

{
  ushort uVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar4;
  KeyValue *extraout_RDX;
  KeyValue *pKVar5;
  KeyValue *this_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar7;
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> local_38;
  ulong uVar3;
  
  this_00 = (this->map_).flat;
  if (this->flat_capacity_ < 0x101) {
    uVar1 = this->flat_size_;
    pKVar5 = this_00 + uVar1;
    uVar3 = (ulong)uVar1;
    if (uVar1 != 0) {
      do {
        uVar2 = uVar3 >> 1;
        uVar4 = uVar2;
        if (this_00[uVar2].first < key) {
          uVar4 = ~uVar2 + uVar3;
          this_00 = this_00 + uVar2 + 1;
        }
        uVar3 = uVar4;
      } while (0 < (long)uVar4);
    }
    if ((this_00 == pKVar5) || (this_00->first != key)) {
      if (uVar1 < this->flat_capacity_) {
        if (this_00 != pKVar5) {
          memmove(this_00 + 1,this_00,(long)pKVar5 - (long)this_00);
          pKVar5 = extraout_RDX;
        }
        this->flat_size_ = this->flat_size_ + 1;
        this_00->first = key;
        (this_00->second).field_0.int64_value = 0;
        (this_00->second).type = '\0';
        (this_00->second).is_repeated = false;
        (this_00->second).field_0xa = 0;
        (this_00->second).is_packed = false;
        (this_00->second).cached_size = 0;
        (this_00->second).descriptor = (FieldDescriptor *)0x0;
        pVar6._9_7_ = (int7)((ulong)pKVar5 >> 8);
        pVar6.second = true;
        pVar6.first = &this_00->second;
      }
      else {
        GrowCapacity(this,(ulong)uVar1 + 1);
        pVar6 = Insert(this,key);
      }
    }
    else {
      pVar6._8_8_ = 0;
      pVar6.first = &this_00->second;
    }
  }
  else {
    local_38.second.field_0.int64_value = 0;
    local_38.second.type = '\0';
    local_38.second.is_repeated = false;
    local_38.second._10_1_ = 0;
    local_38.second.is_packed = false;
    local_38.second.cached_size = 0;
    local_38.second.descriptor = (FieldDescriptor *)0x0;
    local_38.first = key;
    pVar7 = std::
            _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
            ::
            _M_insert_unique<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
                      ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                        *)this_00,&local_38);
    pVar6._8_8_ = pVar7._8_8_;
    pVar6.first = (Extension *)&pVar7.first._M_node._M_node[1]._M_parent;
  }
  return pVar6;
}

Assistant:

std::pair<ExtensionSet::Extension*, bool> ExtensionSet::Insert(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    auto maybe = map_.large->insert({key, Extension()});
    return {&maybe.first->second, maybe.second};
  }
  KeyValue* end = flat_end();
  KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    return {&it->second, false};
  }
  if (flat_size_ < flat_capacity_) {
    std::copy_backward(it, end, end + 1);
    ++flat_size_;
    it->first = key;
    it->second = Extension();
    return {&it->second, true};
  }
  GrowCapacity(flat_size_ + 1);
  return Insert(key);
}